

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

vector<Chainstate_*,_std::allocator<Chainstate_*>_> * __thiscall
ChainstateManager::GetAll
          (vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__return_storage_ptr__,
          ChainstateManager *this)

{
  pointer *pppCVar1;
  iterator __position;
  long lVar2;
  long in_FS_OFFSET;
  Chainstate *cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  Chainstate *local_50;
  unique_lock<std::recursive_mutex> local_48;
  _Head_base<0UL,_Chainstate_*,_false> local_38;
  Chainstate *pCStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &cs_main.super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  pCStack_30 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  lVar2 = 0;
  do {
    local_50 = *(Chainstate **)((long)&local_38._M_head_impl + lVar2);
    if ((local_50 != (Chainstate *)0x0) && (local_50->m_disabled == false)) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Chainstate*,std::allocator<Chainstate*>>::_M_realloc_insert<Chainstate*const&>
                  ((vector<Chainstate*,std::allocator<Chainstate*>> *)__return_storage_ptr__,
                   __position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Chainstate*> ChainstateManager::GetAll()
{
    LOCK(::cs_main);
    std::vector<Chainstate*> out;

    for (Chainstate* cs : {m_ibd_chainstate.get(), m_snapshot_chainstate.get()}) {
        if (this->IsUsable(cs)) out.push_back(cs);
    }

    return out;
}